

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O2

int ffsrow(fitsfile *infptr,fitsfile *outfptr,char *expr,int *status)

{
  char *pcVar1;
  char cVar2;
  size_t nchars;
  long firstrow;
  int iVar3;
  uchar *values;
  FITSfile *pFVar4;
  LONGLONG bytepos;
  long lVar5;
  long lVar6;
  long lVar7;
  size_t __size;
  int i;
  long lVar8;
  long lVar9;
  long lVar10;
  long nelem;
  LONGLONG local_248;
  long local_228;
  LONGLONG offset;
  size_t local_1f8;
  long local_1f0;
  LONGLONG repeat;
  long local_1e0;
  int naxis;
  parseInfo Info;
  ParseData lParse;
  long naxes [5];
  
  if (*status != 0) {
    return *status;
  }
  memset(&Info,0,0x90);
  iVar3 = ffiprs(infptr,0,expr,5,&Info.datatype,&local_1e0,&naxis,naxes,&lParse,status);
  if (iVar3 == 0) {
    lVar8 = -local_1e0;
    if (0 < local_1e0) {
      lVar8 = local_1e0;
    }
    if ((Info.datatype != 0xe) || (lVar8 != 1)) {
      ffcprs(&lParse);
      ffpmsg("Expression does not evaluate to a logical scalar.");
      *status = 0x1b0;
      return 0x1b0;
    }
    if (infptr->HDUposition != infptr->Fptr->curhdu) {
      ffmahd(infptr,infptr->HDUposition + 1,(int *)0x0,status);
    }
    if (*status == 0) {
      pFVar4 = infptr->Fptr;
      lVar8 = pFVar4->numrows;
      if (lVar8 != 0) {
        nchars = pFVar4->rowlength;
        lVar10 = pFVar4->heapsize;
        pFVar4 = outfptr->Fptr;
        if (outfptr->HDUposition != pFVar4->curhdu) {
          ffmahd(outfptr,outfptr->HDUposition + 1,(int *)0x0,status);
          pFVar4 = outfptr->Fptr;
        }
        if (pFVar4->datastart < 0) {
          ffrdef(outfptr,status);
        }
        if (*status == 0) {
          pFVar4 = outfptr->Fptr;
          firstrow = pFVar4->numrows;
          if (firstrow == 0) {
            pFVar4->heapsize = 0;
            local_228 = 0;
          }
          else {
            local_228 = pFVar4->heapsize;
          }
          if (nchars != pFVar4->rowlength) {
            ffpmsg("Output table has different row length from input");
            ffcprs(&lParse);
            *status = 0x1b4;
            return 0x1b4;
          }
          local_1f8 = lVar8 + 1;
          Info.dataPtr = malloc(local_1f8);
          Info.nullPtr = (void *)0x0;
          Info.maxRows = lVar8;
          Info.parseData = &lParse;
          if (Info.dataPtr == (void *)0x0) {
            ffpmsg("Unable to allocate memory for row selection");
LAB_00122c26:
            ffcprs(&lParse);
            *status = 0x71;
            return 0x71;
          }
          *(undefined1 *)((long)Info.dataPtr + lVar8) = 0;
          if (local_1e0 < 0) {
            cVar2 = lParse.Nodes[lParse.resultNode].value.data.log;
            lVar7 = 0;
            lVar6 = 0;
            if (0 < lVar8) {
              lVar6 = lVar8;
            }
            for (; lVar6 != lVar7; lVar7 = lVar7 + 1) {
              *(char *)((long)Info.dataPtr + lVar7) = cVar2;
            }
            lVar6 = 0;
            if (cVar2 != '\0') {
              lVar6 = lVar8;
            }
          }
          else {
            lVar6 = 0;
            ffiter(lParse.nCols,lParse.colData,0,0,fits_parser_workfn,&Info,status);
            lVar7 = 0;
            if (0 < lVar8) {
              lVar7 = lVar8;
            }
            for (lVar5 = 0; lVar7 != lVar5; lVar5 = lVar5 + 1) {
              lVar6 = (lVar6 + 1) - (ulong)(*(char *)((long)Info.dataPtr + lVar5) == '\0');
            }
          }
          if (*status == 0) {
            __size = 500000;
            if (500000 < (long)nchars) {
              __size = nchars;
            }
            values = (uchar *)malloc(__size);
            if (values == (uchar *)0x0) goto LAB_00122c26;
            lVar5 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(500000)) / SEXT816((long)nchars),0);
            lVar7 = 1;
            if (lVar5 < 2) {
              lVar5 = lVar7;
            }
            if (infptr == outfptr) {
              lVar7 = 0;
              do {
                local_248 = lVar7 + 1;
                pcVar1 = (char *)((long)Info.dataPtr + lVar7);
                lVar7 = local_248;
              } while (*pcVar1 != '\0');
            }
            else {
              local_248 = firstrow + 1;
              if (0 < firstrow) {
                ffirow(outfptr,firstrow,lVar6,status);
              }
            }
            local_1f0 = lVar5 * nchars;
            lVar9 = 0;
            do {
              if (*(char *)((long)Info.dataPtr + lVar7 + -1) != '\0') {
                ffgtbb(infptr,lVar7,1,nchars,values + lVar9 * nchars,status);
                lVar9 = lVar9 + 1;
                if (lVar9 == lVar5) {
                  ffptbb(outfptr,local_248,1,local_1f0,values,status);
                  local_248 = local_248 + lVar5;
                  lVar9 = 0;
                }
              }
            } while ((lVar7 < lVar8) && (lVar7 = lVar7 + 1, *status == 0));
            if (lVar9 != 0) {
              ffptbb(outfptr,local_248,1,nchars * lVar9,values,status);
              local_248 = local_248 + lVar9;
            }
            if (infptr == outfptr) {
              if (local_248 <= lVar8) {
                ffdrow(infptr,local_248,local_1f8 - local_248,status);
              }
            }
            else if ((lVar10 != 0) && (lVar6 != 0)) {
              pFVar4 = outfptr->Fptr;
              if (outfptr->HDUposition != pFVar4->curhdu) {
                ffmahd(outfptr,outfptr->HDUposition + 1,(int *)0x0,status);
                pFVar4 = outfptr->Fptr;
              }
              lVar8 = pFVar4->datastart;
              lVar7 = pFVar4->heapstart + local_228;
              lVar5 = (lVar7 + 0xb3f) % 0xb40;
              if (0xb3f - lVar5 < lVar10) {
                ffiblk(outfptr,(lVar5 + lVar10) / 0xb40,1,status);
              }
              ffukyj(outfptr,"PCOUNT",local_228 + lVar10,(char *)0x0,status);
              pFVar4 = infptr->Fptr;
              if (infptr->HDUposition != pFVar4->curhdu) {
                ffmahd(infptr,infptr->HDUposition + 1,(int *)0x0,status);
                pFVar4 = infptr->Fptr;
              }
              bytepos = pFVar4->heapstart + pFVar4->datastart;
              lVar7 = lVar7 + lVar8;
              while ((lVar10 != 0 && (*status == 0))) {
                lVar8 = 500000;
                if (lVar10 < 500000) {
                  lVar8 = lVar10;
                }
                ffmbyt(infptr,bytepos,0,status);
                ffgbyt(infptr,lVar8,values,status);
                ffmbyt(outfptr,lVar7,1,status);
                ffpbyt(outfptr,lVar8,values,status);
                bytepos = bytepos + lVar8;
                lVar7 = lVar7 + lVar8;
                lVar10 = lVar10 - lVar8;
              }
              if (local_228 != 0) {
                for (lVar8 = 1; lVar8 <= outfptr->Fptr->tfield; lVar8 = lVar8 + 1) {
                  lVar10 = firstrow;
                  if (outfptr->Fptr->tableptr[lVar8 + -1].tdatatype < 0) {
                    while (lVar10 < lVar6 + firstrow) {
                      lVar10 = lVar10 + 1;
                      ffgdesll(outfptr,(int)lVar8,lVar10,&repeat,&offset,status);
                      offset = offset + local_228;
                      ffpdes(outfptr,(int)lVar8,lVar10,repeat,offset,status);
                    }
                  }
                }
              }
            }
            free(values);
          }
          if (Info.dataPtr == (void *)0x0) {
            printf("invalid free(Info.dataPtr) at %s:%d\n",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/support/cfitsio/cfitsio-4.6.2/eval_f.c"
                   ,400);
          }
          else {
            free(Info.dataPtr);
          }
          ffcprs(&lParse);
          ffcmph(outfptr,status);
          goto LAB_00122a0c;
        }
      }
    }
  }
  ffcprs(&lParse);
LAB_00122a0c:
  return *status;
}

Assistant:

int ffsrow( fitsfile *infptr,   /* I - Input FITS file                      */
            fitsfile *outfptr,  /* I - Output FITS file                     */
            char     *expr,     /* I - Boolean expression                   */
            int      *status )  /* O - Error status                         */
/*                                                                          */
/* Evaluate an expression on all rows of a table.  If the input and output  */
/* files are not the same, copy the TRUE rows to the output file.  If the   */
/* files are the same, delete the FALSE rows (preserve the TRUE rows).      */
/* Can copy rows between extensions of the same file, *BUT* if output       */
/* extension is before the input extension, the second extension *MUST* be  */
/* opened using ffreopen, so that CFITSIO can handle changing file lengths. */
/*--------------------------------------------------------------------------*/
{
   parseInfo Info;
   int naxis, constant;
   long nelem, rdlen, naxes[MAXDIMS], maxrows, nbuff, nGood, inloc, outloc;
   LONGLONG ntodo, inbyteloc, outbyteloc, hsize;
   long freespace;
   unsigned char *buffer, result;
   struct {
      LONGLONG rowLength, numRows, heapSize;
      LONGLONG dataStart, heapStart;
   } inExt, outExt;
   ParseData lParse;

   if( *status ) return( *status );

   memset(&Info, 0, sizeof(Info));   
   memset(&inExt, 0, sizeof(inExt));
   memset(&outExt, 0, sizeof(outExt));

   if( ffiprs( infptr, 0, expr, MAXDIMS, &Info.datatype, &nelem, &naxis,
               naxes, &lParse, status ) ) {
      ffcprs(&lParse);
      return( *status );
   }

   if( nelem<0 ) {
      constant = 1;
      nelem = -nelem;
   } else
      constant = 0;

   /**********************************************************************/
   /* Make sure expression evaluates to the right type... logical scalar */
   /**********************************************************************/

   if( Info.datatype!=TLOGICAL || nelem!=1 ) {
      ffcprs(&lParse);
      ffpmsg("Expression does not evaluate to a logical scalar.");
      return( *status = PARSE_BAD_TYPE );
   }

   /***********************************************************/
   /*  Extract various table information from each extension  */
   /***********************************************************/

   if( infptr->HDUposition != (infptr->Fptr)->curhdu )
      ffmahd( infptr, (infptr->HDUposition) + 1, NULL, status );
   if( *status ) {
      ffcprs(&lParse);
      return( *status );
   }
   inExt.rowLength = (long) (infptr->Fptr)->rowlength;
   inExt.numRows   = (infptr->Fptr)->numrows;
   inExt.heapSize  = (infptr->Fptr)->heapsize;
   if( inExt.numRows == 0 ) { /* Nothing to copy */
      ffcprs(&lParse);
      return( *status );
   }

   if( outfptr->HDUposition != (outfptr->Fptr)->curhdu )
      ffmahd( outfptr, (outfptr->HDUposition) + 1, NULL, status );
   if( (outfptr->Fptr)->datastart < 0 )
      ffrdef( outfptr, status );
   if( *status ) {
      ffcprs(&lParse);
      return( *status );
   }
   outExt.rowLength = (long) (outfptr->Fptr)->rowlength;
   outExt.numRows   = (outfptr->Fptr)->numrows;
   if( !outExt.numRows )
      (outfptr->Fptr)->heapsize = 0L;
   outExt.heapSize  = (outfptr->Fptr)->heapsize;

   if( inExt.rowLength != outExt.rowLength ) {
      ffpmsg("Output table has different row length from input");
      ffcprs(&lParse);
      return( *status = PARSE_BAD_OUTPUT );
   }

   /***********************************/
   /*  Fill out Info data for parser  */
   /***********************************/

   Info.dataPtr = (char *)malloc( (size_t) ((inExt.numRows + 1) * sizeof(char)) );
   Info.nullPtr = NULL;
   Info.maxRows = (long) inExt.numRows;
   Info.parseData = &lParse;
   if( !Info.dataPtr ) {
      ffpmsg("Unable to allocate memory for row selection");
      ffcprs(&lParse);
      return( *status = MEMORY_ALLOCATION );
   }
   
   /* make sure array is zero terminated */
   ((char*)Info.dataPtr)[inExt.numRows] = 0;

   if( constant ) { /*  Set all rows to the same value from constant result  */

      result = lParse.Nodes[lParse.resultNode].value.data.log;
      for( ntodo = 0; ntodo<inExt.numRows; ntodo++ )
         ((char*)Info.dataPtr)[ntodo] = result;
      nGood = (long) (result ? inExt.numRows : 0);

   } else {

      ffiter( lParse.nCols, lParse.colData, 0L, 0L,
              fits_parser_workfn, (void*)&Info, status );

      nGood = 0;
      for( ntodo = 0; ntodo<inExt.numRows; ntodo++ )
         if( ((char*)Info.dataPtr)[ntodo] ) nGood++;
   }

   if( *status ) {
      /* Error... Do nothing */
   } else {
      rdlen  = (long) inExt.rowLength;
      buffer = (unsigned char *)malloc(maxvalue(500000,rdlen) * sizeof(char) );
      if( buffer==NULL ) {
         ffcprs(&lParse);
         return( *status=MEMORY_ALLOCATION );
      }
      maxrows = maxvalue( (500000L/rdlen), 1);
      nbuff = 0;
      inloc = 1;
      if( infptr==outfptr ) { /* Skip initial good rows if input==output file */
         while( ((char*)Info.dataPtr)[inloc-1] ) inloc++;
         outloc = inloc;
      } else {
         outloc = (long) (outExt.numRows + 1);
         if (outloc > 1) 
            ffirow( outfptr, outExt.numRows, nGood, status );
      }

      do {
         if( ((char*)Info.dataPtr)[inloc-1] ) {
            ffgtbb( infptr, inloc, 1L, rdlen, buffer+rdlen*nbuff, status );
            nbuff++;
            if( nbuff==maxrows ) {
               ffptbb( outfptr, outloc, 1L, rdlen*nbuff, buffer,  status );
               outloc += nbuff;
               nbuff = 0;
            }
         }
         inloc++;
      } while( !*status && inloc<=inExt.numRows );

      if( nbuff ) {
         ffptbb( outfptr, outloc, 1L, rdlen*nbuff, buffer,  status );
         outloc += nbuff;
      }

      if( infptr==outfptr ) {

         if( outloc<=inExt.numRows )
            ffdrow( infptr, outloc, inExt.numRows-outloc+1, status );

      } else if( inExt.heapSize && nGood ) {

         /* Copy heap, if it exists and at least one row copied */

         /********************************************************/
         /*  Get location information from the output extension  */
         /********************************************************/

         if( outfptr->HDUposition != (outfptr->Fptr)->curhdu )
            ffmahd( outfptr, (outfptr->HDUposition) + 1, NULL, status );
         outExt.dataStart = (outfptr->Fptr)->datastart;
         outExt.heapStart = (outfptr->Fptr)->heapstart;

         /*************************************************/
         /*  Insert more space into outfptr if necessary  */
         /*************************************************/

         hsize     = outExt.heapStart + outExt.heapSize;
         freespace = (long) (( ( (hsize + 2879) / 2880) * 2880) - hsize);
         ntodo     = inExt.heapSize;

         if ( (freespace - ntodo) < 0) {       /* not enough existing space? */
            ntodo = (ntodo - freespace + 2879) / 2880;  /* number of blocks  */
            ffiblk(outfptr, (long) ntodo, 1, status);   /* insert the blocks */
         }
         ffukyj( outfptr, "PCOUNT", inExt.heapSize+outExt.heapSize,
                 NULL, status );

         /*******************************************************/
         /*  Get location information from the input extension  */
         /*******************************************************/

         if( infptr->HDUposition != (infptr->Fptr)->curhdu )
            ffmahd( infptr, (infptr->HDUposition) + 1, NULL, status );
         inExt.dataStart = (infptr->Fptr)->datastart;
         inExt.heapStart = (infptr->Fptr)->heapstart;

         /**********************************/
         /*  Finally copy heap to outfptr  */
         /**********************************/

         ntodo  =  inExt.heapSize;
         inbyteloc  =  inExt.heapStart +  inExt.dataStart;
         outbyteloc = outExt.heapStart + outExt.dataStart + outExt.heapSize;

         while ( ntodo && !*status ) {
            rdlen = (long) minvalue(ntodo,500000);
            ffmbyt( infptr,  inbyteloc,  REPORT_EOF, status );
            ffgbyt( infptr,  rdlen,  buffer,     status );
            ffmbyt( outfptr, outbyteloc, IGNORE_EOF, status );
            ffpbyt( outfptr, rdlen,  buffer,     status );
            inbyteloc  += rdlen;
            outbyteloc += rdlen;
            ntodo  -= rdlen;
         }

         /***********************************************************/
         /*  But must update DES if data is being appended to a     */
         /*  pre-existing heap space.  Edit each new entry in file  */
         /***********************************************************/

         if( outExt.heapSize ) {
            LONGLONG repeat, offset, j;
            int i;
            for( i=1; i<=(outfptr->Fptr)->tfield; i++ ) {
               if( (outfptr->Fptr)->tableptr[i-1].tdatatype<0 ) {
                  for( j=outExt.numRows+1; j<=outExt.numRows+nGood; j++ ) {
                     ffgdesll( outfptr, i, j, &repeat, &offset, status );
                     offset += outExt.heapSize;
                     ffpdes( outfptr, i, j, repeat, offset, status );
                  }
               }
            }
         }

      } /*  End of HEAP copy  */

      FREE(buffer);
   }

   FREE(Info.dataPtr);
   ffcprs(&lParse);

   ffcmph(outfptr, status);  /* compress heap, deleting any orphaned data */
   return(*status);
}